

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op_helper.c
# Opt level: O0

uint32_t helper_shl_cc_aarch64(CPUARMState_conflict *env,uint32_t x,uint32_t i)

{
  uint uVar1;
  int shift;
  uint32_t i_local;
  uint32_t x_local;
  CPUARMState_conflict *env_local;
  
  uVar1 = i & 0xff;
  if (uVar1 < 0x20) {
    env_local._4_4_ = x;
    if (uVar1 != 0) {
      env->CF = x >> (0x20 - (byte)i & 0x1f) & 1;
      env_local._4_4_ = x << ((byte)i & 0x1f);
    }
  }
  else {
    if (uVar1 == 0x20) {
      env->CF = x & 1;
    }
    else {
      env->CF = 0;
    }
    env_local._4_4_ = 0;
  }
  return env_local._4_4_;
}

Assistant:

uint32_t HELPER(shl_cc)(CPUARMState *env, uint32_t x, uint32_t i)
{
    int shift = i & 0xff;
    if (shift >= 32) {
        if (shift == 32)
            env->CF = x & 1;
        else
            env->CF = 0;
        return 0;
    } else if (shift != 0) {
        env->CF = (x >> (32 - shift)) & 1;
        return x << shift;
    }
    return x;
}